

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.cpp
# Opt level: O0

bool anon_unknown.dwarf_2c124::serialize_vector<char>
               (char *objs,int32_t n,SerializationBuffer *buffer,size_t *offset,Serialize *op)

{
  size_t sVar1;
  size_t __n;
  size_type sVar2;
  char *pcVar3;
  size_t *in_RCX;
  vector<char,_std::allocator<char>_> *in_RDX;
  int in_ESI;
  void *in_RDI;
  Serialize *in_R8;
  unsigned_long osize;
  undefined4 in_stack_fffffffffffffff0;
  
  __n = (size_t)in_ESI;
  sVar1 = *in_RCX;
  sVar2 = std::vector<char,_std::allocator<char>_>::size(in_RDX);
  if (sVar2 < sVar1 + __n) {
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               (size_type)in_RDX);
  }
  pcVar3 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1467b9);
  memcpy(pcVar3 + *in_RCX,in_RDI,__n);
  advance<GGSock::Serialize>(in_RCX,__n,in_R8);
  return true;
}

Assistant:

inline bool serialize_vector(const T * objs, int32_t n, GGSock::SerializationBuffer & buffer, size_t & offset, GGSock::Serialize & op) noexcept {
            static_assert(std::is_fundamental<T>::value, "Fundamental type required");

            auto osize = sizeof(T)*n;

            if (offset + osize > buffer.size()) {
                buffer.resize(offset + osize);
            }

            std::memcpy(buffer.data() + offset, objs, osize);
            ::advance(offset, osize, op);

            return true;
        }